

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::arraypool::~arraypool(arraypool *this)

{
  char ***pppcVar1;
  int iVar2;
  char **__ptr;
  long lVar3;
  
  pppcVar1 = &this->toparray;
  __ptr = this->toparray;
  if (__ptr != (char **)0x0) {
    iVar2 = this->toparraylen;
    if (0 < iVar2) {
      lVar3 = 0;
      do {
        if ((*pppcVar1)[lVar3] != (char *)0x0) {
          free((*pppcVar1)[lVar3]);
          iVar2 = this->toparraylen;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar2);
      __ptr = *pppcVar1;
    }
    free(__ptr);
  }
  this->toparraylen = 0;
  *pppcVar1 = (char **)0x0;
  this->objects = 0;
  this->totalmemory = 0;
  return;
}

Assistant:

tetgenmesh::arraypool::~arraypool()
{
  int i;

  // Has anything been allocated at all?
  if (toparray != (char **) NULL) {
    // Walk through the top array.
    for (i = 0; i < toparraylen; i++) {
      // Check every pointer; NULLs may be scattered randomly.
      if (toparray[i] != (char *) NULL) {
        // Free an allocated block.
        free((void *) toparray[i]);
      }
    }
    // Free the top array.
    free((void *) toparray);
  }

  // The top array is no longer allocated.
  toparray = (char **) NULL;
  toparraylen = 0;
  objects = 0;
  totalmemory = 0;
}